

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::BP5Writer::WriteMetadataFileIndex
          (BP5Writer *this,uint64_t MetaDataPos,uint64_t MetaDataSize)

{
  Comm *this_00;
  undefined8 *puVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer puVar4;
  undefined8 uVar5;
  int iVar6;
  char *src;
  long lVar7;
  ulong uVar8;
  size_type __n;
  size_t sVar9;
  long lVar10;
  int writer;
  long lVar11;
  allocator local_89;
  vector<char,_std::allocator<char>_> buf;
  size_t local_68;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *local_60;
  uint64_t local_58;
  string local_50;
  
  pvVar2 = (this->FlushPosSizeInfo).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar3 = (this->FlushPosSizeInfo).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = &(this->super_Engine).m_Comm;
  iVar6 = helper::Comm::Size(this_00);
  lVar10 = (ulong)(MetaDataPos == 0) * 0x40 +
           (long)iVar6 * ((((long)pvVar2 - (long)pvVar3) / 0x18) * 2 + 1) * 8;
  __n = lVar10 + 0x21;
  if ((this->m_WriterSubfileMap).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->m_WriterSubfileMap).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    iVar6 = helper::Comm::Size(this_00);
    __n = lVar10 + 0x42 + (long)iVar6 * 8;
  }
  std::vector<char,_std::allocator<char>_>::vector(&buf,__n,(allocator_type *)&local_68);
  local_68 = 0;
  if (MetaDataPos == 0) {
    std::__cxx11::string::string((string *)&local_50,"Index Table",&local_89);
    MakeHeader(this,&buf,&local_68,&local_50,true);
    std::__cxx11::string::~string((string *)&local_50);
  }
  sVar9 = local_68;
  local_58 = MetaDataSize;
  if ((this->m_WriterSubfileMap).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->m_WriterSubfileMap).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
    [local_68] = 'w';
    iVar6 = helper::Comm::Size(this_00);
    *(long *)(buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start + sVar9 + 1) = (long)iVar6 * 8 + 0x18;
    iVar6 = helper::Comm::Size(this_00);
    *(long *)(buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start + sVar9 + 9) = (long)iVar6;
    *(size_t *)
     (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start +
     sVar9 + 0x11) = this->m_Aggregator->m_NumAggregators;
    *(size_t *)
     (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start +
     sVar9 + 0x19) = this->m_Aggregator->m_SubStreams;
    puVar4 = (this->m_WriterSubfileMap).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar6 = helper::Comm::Size(this_00);
    if (iVar6 != 0) {
      memmove(buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start + sVar9 + 0x21,puVar4,(long)iVar6 * 8);
    }
    sVar9 = (long)iVar6 * 8 + sVar9 + 0x21;
    puVar4 = (this->m_WriterSubfileMap).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->m_WriterSubfileMap).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
        ._M_impl.super__Vector_impl_data._M_finish != puVar4) {
      (this->m_WriterSubfileMap).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar4;
    }
  }
  buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
  [sVar9] = 's';
  pvVar2 = (this->FlushPosSizeInfo).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (this->FlushPosSizeInfo).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar6 = helper::Comm::Size(this_00);
  local_60 = &this->FlushPosSizeInfo;
  *(long *)(buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start + sVar9 + 1) =
       (long)iVar6 * ((((long)pvVar3 - (long)pvVar2) / 0x18) * 2 + 1) * 8 + 0x18;
  *(uint64_t *)
   (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start +
   sVar9 + 9) = MetaDataPos;
  *(uint64_t *)
   (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start +
   sVar9 + 0x11) = local_58;
  *(long *)(buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start + sVar9 + 0x19) =
       ((long)(this->FlushPosSizeInfo).
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->FlushPosSizeInfo).
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  lVar10 = sVar9 + 0x21;
  for (lVar11 = 0; iVar6 = helper::Comm::Size(this_00), lVar11 < iVar6; lVar11 = lVar11 + 1) {
    lVar10 = lVar10 + 8;
    lVar7 = 0;
    for (uVar8 = 0;
        pvVar2 = (this->FlushPosSizeInfo).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar8 < (ulong)(((long)(this->FlushPosSizeInfo).
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18);
        uVar8 = uVar8 + 1) {
      puVar1 = (undefined8 *)
               (*(long *)((long)&(pvVar2->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl.super__Vector_impl_data + lVar7) + lVar11 * 0x10);
      uVar5 = puVar1[1];
      *(undefined8 *)
       (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       + lVar10 + -8) = *puVar1;
      *(undefined8 *)
       (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
        + lVar10 + -8 + 8) = uVar5;
      lVar10 = lVar10 + 0x10;
      lVar7 = lVar7 + 0x18;
    }
    *(unsigned_long *)
     (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start +
     lVar10 + -8) =
         (this->m_WriterDataPos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_start[lVar11];
  }
  transportman::TransportMan::WriteFiles
            (&this->m_FileMetadataIndexManager,
             buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start,(long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,-1);
  transportman::TransportMan::FlushFiles(&this->m_FileMetadataIndexManager,-1);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear(local_60);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buf.super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

void BP5Writer::WriteMetadataFileIndex(uint64_t MetaDataPos, uint64_t MetaDataSize)
{
    // bufsize: Step record
    size_t bufsize =
        1 + (4 + ((FlushPosSizeInfo.size() * 2) + 1) * m_Comm.Size()) * sizeof(uint64_t);
    if (MetaDataPos == 0)
    {
        //  First time, write the headers
        bufsize += m_IndexHeaderSize;
    }
    if (!m_WriterSubfileMap.empty())
    {
        // WriterMap record
        bufsize += 1 + (4 + m_Comm.Size()) * sizeof(uint64_t);
    }

    std::vector<char> buf(bufsize);
    size_t pos = 0;
    uint64_t d;
    unsigned char record;

    if (MetaDataPos == 0)
    {
        //  First time, write the headers
        MakeHeader(buf, pos, "Index Table", true);
    }

    // WriterMap record
    if (!m_WriterSubfileMap.empty())
    {
        record = WriterMapRecord;
        helper::CopyToBuffer(buf, pos, &record, 1); // record type
        d = (3 + m_Comm.Size()) * sizeof(uint64_t);
        helper::CopyToBuffer(buf, pos, &d, 1); // record length
        d = static_cast<uint64_t>(m_Comm.Size());
        helper::CopyToBuffer(buf, pos, &d, 1);
        d = static_cast<uint64_t>(m_Aggregator->m_NumAggregators);
        helper::CopyToBuffer(buf, pos, &d, 1);
        d = static_cast<uint64_t>(m_Aggregator->m_SubStreams);
        helper::CopyToBuffer(buf, pos, &d, 1);
        helper::CopyToBuffer(buf, pos, m_WriterSubfileMap.data(), m_Comm.Size());
        m_WriterSubfileMap.clear();
    }

    // Step record
    record = StepRecord;
    helper::CopyToBuffer(buf, pos, &record, 1); // record type
    d = (3 + ((FlushPosSizeInfo.size() * 2) + 1) * m_Comm.Size()) * sizeof(uint64_t);
    helper::CopyToBuffer(buf, pos, &d, 1); // record length
    helper::CopyToBuffer(buf, pos, &MetaDataPos, 1);
    helper::CopyToBuffer(buf, pos, &MetaDataSize, 1);
    d = static_cast<uint64_t>(FlushPosSizeInfo.size());
    helper::CopyToBuffer(buf, pos, &d, 1);

    for (int writer = 0; writer < m_Comm.Size(); writer++)
    {
        for (size_t flushNum = 0; flushNum < FlushPosSizeInfo.size(); flushNum++)
        {
            // add two numbers here
            helper::CopyToBuffer(buf, pos, &FlushPosSizeInfo[flushNum][2 * writer], 2);
        }
        helper::CopyToBuffer(buf, pos, &m_WriterDataPos[writer], 1);
    }

    m_FileMetadataIndexManager.WriteFiles((char *)buf.data(), buf.size());
#ifdef DUMPDATALOCINFO
    std::cout << "Flush count is :" << FlushPosSizeInfo.size() << std::endl;
    std::cout << "Write Index positions = {" << std::endl;

    for (size_t i = 0; i < m_Comm.Size(); ++i)
    {
        std::cout << "Writer " << i << " has data at: " << std::endl;
        uint64_t eachWriterSize = FlushPosSizeInfo.size() * 2 + 1;
        for (size_t j = 0; j < FlushPosSizeInfo.size(); ++j)
        {
            std::cout << "loc:" << buf[3 + eachWriterSize * i + j * 2]
                      << " siz:" << buf[3 + eachWriterSize * i + j * 2 + 1] << std::endl;
        }
        std::cout << "loc:" << buf[3 + eachWriterSize * (i + 1) - 1] << std::endl;
    }
    std::cout << "}" << std::endl;
#endif
    m_FileMetadataIndexManager.FlushFiles();

    /* reset for next timestep */
    FlushPosSizeInfo.clear();
}